

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::CheckCMP0037(cmGlobalGenerator *this,string *targetName,string *reason)

{
  PolicyStatus PVar1;
  cmTarget *this_00;
  ostream *poVar2;
  cmake *this_01;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  string local_208;
  string local_1e8;
  byte local_1b1;
  undefined1 local_1b0 [7];
  bool issueMessage;
  ostringstream e;
  MessageType local_34;
  MessageType messageType;
  cmTarget *tgt;
  string *reason_local;
  string *targetName_local;
  cmGlobalGenerator *this_local;
  
  this_00 = FindTarget(this,targetName,false);
  if (this_00 == (cmTarget *)0x0) {
    return true;
  }
  local_34 = AUTHOR_WARNING;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  local_1b1 = 0;
  PVar1 = cmTarget::GetPolicyStatusCMP0037(this_00);
  if (PVar1 != OLD) {
    if (PVar1 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x25,id);
      poVar2 = std::operator<<((ostream *)local_1b0,(string *)&local_1e8);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_1e8);
      local_1b1 = 1;
    }
    else if (PVar1 - NEW < 3) {
      local_1b1 = 1;
      local_34 = FATAL_ERROR;
    }
  }
  if ((local_1b1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)local_1b0,"The target name \"");
    poVar2 = std::operator<<(poVar2,(string *)targetName);
    poVar2 = std::operator<<(poVar2,"\" is reserved ");
    poVar2 = std::operator<<(poVar2,(string *)reason);
    std::operator<<(poVar2,".");
    if (local_34 == AUTHOR_WARNING) {
      std::operator<<((ostream *)local_1b0,"  It may result in undefined behavior.");
    }
    this_01 = GetCMakeInstance(this);
    std::__cxx11::ostringstream::str();
    backtrace = cmTarget::GetBacktrace(this_00);
    cmake::IssueMessage(this_01,local_34,&local_208,backtrace);
    std::__cxx11::string::~string((string *)&local_208);
    if (local_34 == FATAL_ERROR) {
      this_local._7_1_ = false;
      goto LAB_00613563;
    }
  }
  this_local._7_1_ = true;
LAB_00613563:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::CheckCMP0037(std::string const& targetName,
                                     std::string const& reason) const
{
  cmTarget* tgt = this->FindTarget(targetName);
  if (!tgt) {
    return true;
  }
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (tgt->GetPolicyStatusCMP0037()) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
      issueMessage = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName << "\" is reserved " << reason
      << ".";
    if (messageType == MessageType::AUTHOR_WARNING) {
      e << "  It may result in undefined behavior.";
    }
    this->GetCMakeInstance()->IssueMessage(messageType, e.str(),
                                           tgt->GetBacktrace());
    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}